

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O0

uintwide_t<128U,_unsigned_short,_void,_false>
test_uintwide_t_edge::
generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
          (bool is_positive,local_base base_to_get,int digits_in_base_to_get)

{
  result_type rVar1;
  char *str_input;
  char local_131;
  char local_129;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  const_iterator local_d0;
  char local_c1;
  iterator iStack_c0;
  char sign_char_to_insert;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  const_iterator local_b0;
  char *local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  const_iterator local_98;
  char *local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  const_iterator local_80;
  local_base *local_78;
  char *local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string str_x;
  local_base local_20;
  int digits_in_base_to_get_local;
  local_base base_to_get_local;
  bool is_positive_local;
  
  str_x.field_2._12_4_ = digits_in_base_to_get;
  local_20 = base_to_get;
  digits_in_base_to_get_local._3_1_ = is_positive;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,(long)digits_in_base_to_get,'0',&local_49);
  std::allocator<char>::~allocator(&local_49);
  local_68._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  local_70 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
  local_78 = &local_20;
  std::
  generate<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,test_uintwide_t_edge::generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>(bool,test_uintwide_t_edge::local_base,int)::_lambda()_1_>
            (local_68,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_70,(anon_class_8_1_a530db20)local_78);
  if (local_20 == oct) {
    local_88._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_80,&local_88);
    local_90 = (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,local_80,1,'0');
  }
  else if (local_20 == hex) {
    local_a0._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_98,&local_a0);
    local_a8 = (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,local_98,1,'x');
    local_b8._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_b0,&local_b8);
    iStack_c0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,local_b0,1,'0');
  }
  if (local_20 == dec) {
    if ((digits_in_base_to_get_local._3_1_ & 1) == 0) {
      rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&dist_sgn,
                         (discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
                          *)eng_sgn);
      local_131 = '+';
      if (rVar1 == 0) {
        local_131 = '-';
      }
      local_129 = local_131;
    }
    else {
      local_129 = '+';
    }
    local_c1 = local_129;
    local_d8._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_d0,&local_d8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               local_d0,1,local_c1);
  }
  str_input = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_48);
  math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_false>::uintwide_t
            ((uintwide_t<128U,_unsigned_short,_void,_false> *)&base_to_get_local,str_input);
  std::__cxx11::string::~string((string *)local_48);
  return (representation_type)(representation_type)_base_to_get_local;
}

Assistant:

auto generate_wide_integer_value(bool       is_positive           = true,
                                 local_base base_to_get           = local_base::dec,
                                 int        digits_in_base_to_get = std::numeric_limits<IntegralTypeWithStringConstruction>::digits10) -> IntegralTypeWithStringConstruction
{
  using local_integral_type = IntegralTypeWithStringConstruction;

  static_assert(   (  std::numeric_limits<local_integral_type>::is_signed  && std::numeric_limits<local_integral_type>::digits > static_cast<int>(INT8_C(63)))
                || ((!std::numeric_limits<local_integral_type>::is_signed) && std::numeric_limits<local_integral_type>::digits > static_cast<int>(INT8_C(64))),
                "Error: Integral type destination does not have enough digits10");

  std::string str_x(static_cast<std::size_t>(digits_in_base_to_get), '0');

  std::generate(str_x.begin(),
                str_x.end(),
                [&base_to_get]() // NOLINT(modernize-use-trailing-return-type,-warnings-as-errors)
                {
                  char c { };

                  if(base_to_get == local_base::oct)
                  {
                    c = static_cast<char>(dist_dig_oct(eng_dig));
                    c = static_cast<char>(c + '0');
                  }
                  else if(base_to_get == local_base::hex)
                  {
                    c = static_cast<char>(dist_dig_hex(eng_dig));

                    if(c < static_cast<char>(INT8_C(10)))
                    {
                      c = static_cast<char>(c + '0');
                    }
                    else
                    {
                      c =
                        static_cast<char>
                        (
                            static_cast<char>(c + 'A')
                          - static_cast<char>(INT8_C(10))
                        );
                    }
                  }
                  else
                  {
                    c = static_cast<char>(dist_dig_dec(eng_dig));
                    c = static_cast<char>(c + static_cast<char>(INT8_C(0x30)));
                  }

                  return c;
                });

  if(base_to_get == local_base::oct)
  {
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), '0');
  }
  else if(base_to_get == local_base::hex)
  {
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), 'x');
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), '0');
  }

  if(base_to_get == local_base::dec)
  {
    // Insert either a positive sign or a negative sign
    // (always one or the other) depending on the sign of x.
    const auto sign_char_to_insert =
      static_cast<char>
      (
        is_positive
          ? '+'
          : static_cast<char>((dist_sgn(eng_sgn) != static_cast<std::uint32_t>(UINT32_C(0))) ? '+' : '-') // NOLINT(readability-avoid-nested-conditional-operator)
      );

    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), sign_char_to_insert);
  }

  return local_integral_type(str_x.c_str());
}